

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::MaybeTextureSwizzle::isIdentitySwizzle
          (MaybeTextureSwizzle *this)

{
  TextureSwizzleComponent *pTVar1;
  bool local_11;
  MaybeTextureSwizzle *this_local;
  
  local_11 = false;
  if ((this->m_isSome & 1U) != 0) {
    pTVar1 = tcu::
             Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4>::
             operator[](&this->m_swizzle,0);
    local_11 = false;
    if (*pTVar1 == TEXTURESWIZZLECOMPONENT_R) {
      pTVar1 = tcu::
               Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4>::
               operator[](&this->m_swizzle,1);
      local_11 = false;
      if (*pTVar1 == TEXTURESWIZZLECOMPONENT_G) {
        pTVar1 = tcu::
                 Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4>
                 ::operator[](&this->m_swizzle,2);
        local_11 = false;
        if (*pTVar1 == TEXTURESWIZZLECOMPONENT_B) {
          pTVar1 = tcu::
                   Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4>
                   ::operator[](&this->m_swizzle,3);
          local_11 = *pTVar1 == TEXTURESWIZZLECOMPONENT_A;
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool MaybeTextureSwizzle::isIdentitySwizzle (void) const
{
	return	m_isSome									&&
			m_swizzle[0] == TEXTURESWIZZLECOMPONENT_R	&&
			m_swizzle[1] == TEXTURESWIZZLECOMPONENT_G	&&
			m_swizzle[2] == TEXTURESWIZZLECOMPONENT_B	&&
			m_swizzle[3] == TEXTURESWIZZLECOMPONENT_A;
}